

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  cmTarget *this_00;
  bool bVar2;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack> *this_01;
  cmValue cVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  ulong *puVar6;
  _Base_ptr p_Var7;
  cmGeneratorTarget *tgt;
  string namespacedTarget;
  TargetOrString resolved;
  cmGeneratorTarget *local_a0;
  string local_98;
  string local_78;
  TargetOrString local_58;
  
  cmGeneratorTarget::ResolveTargetReference(&local_58,target,input,lg);
  local_a0 = local_58.Target;
  if (local_58.Target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::_M_assign((string *)input);
    goto LAB_0038c79c;
  }
  this_01 = &cmTarget::GetFindPackageStack((local_58.Target)->Target)->
             super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>;
  bVar2 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty(this_01);
  if (bVar2) {
    this_00 = local_a0->Target;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"EXPORT_FIND_PACKAGE_NAME","");
    cVar3 = cmTarget::GetProperty(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (cVar3.Value != (string *)0x0) goto LAB_0038c6af;
  }
  else {
LAB_0038c6af:
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_emplace_unique<cmGeneratorTarget*&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->ExternalTargets,&local_a0);
  }
  bVar2 = cmGeneratorTarget::IsImported(local_a0);
  if (bVar2) {
    cmGeneratorTarget::GetName_abi_cxx11_(local_a0);
    std::__cxx11::string::_M_assign((string *)input);
    goto LAB_0038c79c;
  }
  p_Var4 = (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_0038c73c:
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    (*this->_vptr_cmExportFileGenerator[0xf])(this,&local_98,target);
    if (local_98._M_string_length == 0) {
      cmGeneratorTarget::GetName_abi_cxx11_(local_a0);
    }
    std::__cxx11::string::_M_assign((string *)input);
    local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0038c79c;
  }
  else {
    p_Var1 = &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cmGeneratorTarget **)(p_Var4 + 1) >= local_a0) {
        p_Var7 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(cmGeneratorTarget **)(p_Var4 + 1) < local_a0];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) || (local_a0 < *(cmGeneratorTarget **)(p_Var7 + 1)))
    goto LAB_0038c73c;
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_78,local_a0);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,
                                (ulong)(this->Namespace)._M_dataplus._M_p);
    puVar6 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98.field_2._8_8_ = plVar5[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_98._M_string_length = plVar5[1];
    *plVar5 = (long)puVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)input,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0038c79c;
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0038c79c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.String._M_dataplus._M_p != &local_58.String.field_2) {
    operator_delete(local_58.String._M_dataplus._M_p,
                    local_58.String.field_2._M_allocated_capacity + 1);
  }
  return local_58.Target != (cmGeneratorTarget *)0x0;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(std::string& input,
                                               cmGeneratorTarget const* target,
                                               cmLocalGenerator const* lg)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input, lg);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  cmFindPackageStack const& pkgStack = tgt->Target->GetFindPackageStack();
  if (!pkgStack.Empty() ||
      tgt->Target->GetProperty("EXPORT_FIND_PACKAGE_NAME")) {
    this->ExternalTargets.emplace(tgt);
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}